

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O2

int Sbl_ManEvaluateMappingEdge(Sbl_Man_t *p,int DelayGlo)

{
  int iVar1;
  int Entry;
  abctime aVar2;
  abctime aVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  
  aVar2 = Abc_Clock();
  p->vPath->nSize = 0;
  Sbl_ManGetCurrentMapping(p);
  iVar5 = 1;
  iVar1 = Gia_ManEvalWindow(p->pGia,p->vLeaves,p->vAnds,p->vWindow,p->vPolar,1);
  aVar3 = Abc_Clock();
  p->timeTime = p->timeTime + (aVar3 - aVar2);
  if (DelayGlo < iVar1) {
    iVar5 = 0;
    for (iVar1 = 0; iVar1 < p->vWindow->nSize; iVar1 = iVar1 + 1) {
      pVVar4 = Vec_WecEntry(p->vWindow,iVar1);
      if (0 < pVVar4->nSize) {
        pVVar4 = p->vPath;
        Entry = Abc_Var2Lit(iVar1,1);
        Vec_IntPush(pVVar4,Entry);
      }
    }
  }
  return iVar5;
}

Assistant:

int Sbl_ManEvaluateMappingEdge( Sbl_Man_t * p, int DelayGlo )
{
    abctime clk = Abc_Clock();
    Vec_Int_t * vArray; 
    int i, DelayMax;
    Vec_IntClear( p->vPath );
    // update new timing
    Sbl_ManGetCurrentMapping( p );
    // derive new timing
    DelayMax = Gia_ManEvalWindow( p->pGia, p->vLeaves, p->vAnds, p->vWindow, p->vPolar, 1 );
    p->timeTime += Abc_Clock() - clk;
    if ( DelayMax <= DelayGlo )
        return 1;
    // create critical path composed of all nodes
    Vec_WecForEachLevel( p->vWindow, vArray, i )
        if ( Vec_IntSize(vArray) > 0 )
            Vec_IntPush( p->vPath, Abc_Var2Lit(i, 1) );
    return 0;
}